

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall CryptoUtil_HmacSha256_Test::TestBody(CryptoUtil_HmacSha256_Test *this)

{
  char *message;
  string local_88;
  AssertHelper local_68;
  AssertionResult gtest_ar;
  ByteData256 byte_data;
  ByteData data;
  ByteData key;
  
  std::__cxx11::string::string
            ((string *)&local_88,"616975656F616975656F616975656F616975656F616975656F616975656F6169",
             (allocator *)&data);
  cfd::core::ByteData::ByteData(&key,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)&local_88,"2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22",
             (allocator *)&byte_data);
  cfd::core::ByteData::ByteData(&data,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,&key);
  cfd::core::CryptoUtil::HmacSha256
            (&byte_data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_88,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"5af1c9ec83a512db8ea42f288b82c8a07ed05685c28e3c4c8d4c4e1b2f40b212\"",
             local_88._M_dataplus._M_p,
             "5af1c9ec83a512db8ea42f288b82c8a07ed05685c28e3c4c8d4c4e1b2f40b212");
  std::__cxx11::string::~string((string *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x17b,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(CryptoUtil, HmacSha256) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData data(
      "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
  ByteData256 byte_data = CryptoUtil::HmacSha256(key.GetBytes(), data);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "5af1c9ec83a512db8ea42f288b82c8a07ed05685c28e3c4c8d4c4e1b2f40b212");
}